

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-extract.c
# Opt level: O2

void test_symbol(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char *pcVar5;
  char *val;
  
  uVar3 = bson_bcon_magic();
  uVar3 = bcon_new(0,"foo",uVar3,0xd,"symbol",0);
  uVar4 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar3,"foo",uVar4,0xd,&val,0);
  if (cVar1 == '\0') {
    pcVar5 = "BCON_EXTRACT (bcon, \"foo\", BCONE_SYMBOL (val))";
    uVar3 = 0xc9;
  }
  else {
    iVar2 = strcmp(val,"symbol");
    if (iVar2 == 0) {
      bson_destroy(uVar3);
      return;
    }
    pcVar5 = "strcmp (val, \"symbol\") == 0";
    uVar3 = 0xcb;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
          ,uVar3,"test_symbol",pcVar5);
  abort();
}

Assistant:

static void
test_symbol (void)
{
   const char *val;

   bson_t *bcon = BCON_NEW ("foo", BCON_SYMBOL ("symbol"));

   BSON_ASSERT (BCON_EXTRACT (bcon, "foo", BCONE_SYMBOL (val)));

   BSON_ASSERT (strcmp (val, "symbol") == 0);

   bson_destroy (bcon);
}